

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spooky.cpp
# Opt level: O1

void __thiscall SpookyHash::Update(SpookyHash *this,void *message,size_t length)

{
  long *__src;
  ulong uVar1;
  uint64 uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint64 uVar14;
  uint64 uVar15;
  ulong uVar16;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  
  uVar1 = (ulong)this->m_remainder;
  if (uVar1 + length < 0xc0) {
    memcpy((void *)((long)this->m_data + uVar1),message,length);
    this->m_length = this->m_length + length;
    this->m_remainder = (uint8)(uVar1 + length);
  }
  else {
    uVar3 = this->m_state[0];
    uVar4 = this->m_state[1];
    if (this->m_length < 0xc0) {
      local_68 = 0xdeadbeefdeadbeef;
      local_58 = 0xdeadbeefdeadbeef;
      uVar15 = 0xdeadbeefdeadbeef;
      local_78 = 0xdeadbeefdeadbeef;
      local_70 = uVar4;
      uVar6 = uVar4;
      uVar7 = uVar3;
      uVar2 = uVar4;
      uVar14 = uVar3;
      local_60 = uVar3;
    }
    else {
      local_78 = this->m_state[2];
      local_60 = this->m_state[3];
      local_70 = this->m_state[4];
      local_58 = this->m_state[5];
      uVar14 = this->m_state[6];
      uVar6 = this->m_state[7];
      uVar15 = this->m_state[8];
      uVar7 = this->m_state[9];
      uVar2 = this->m_state[10];
      local_68 = this->m_state[0xb];
    }
    this->m_length = this->m_length + length;
    if (uVar1 != 0) {
      uVar5 = (ulong)(byte)(-this->m_remainder - 0x40);
      memcpy((void *)((long)this->m_data + uVar1),message,uVar5);
      message = (void *)((long)message + uVar5);
      length = length - uVar5;
      uVar3 = uVar3 + this->m_data[0];
      uVar12 = (local_68 ^ uVar3) + uVar4;
      uVar4 = uVar4 + this->m_data[1];
      uVar8 = local_60 ^ uVar12;
      uVar1 = ((uVar3 >> 0x35 | uVar3 * 0x800) ^ uVar4) + (local_78 ^ uVar2);
      uVar3 = (local_78 ^ uVar2) + this->m_data[2];
      local_70 = local_70 ^ uVar1;
      uVar4 = ((uVar4 >> 0x20 | uVar4 << 0x20) ^ uVar3) + uVar8;
      uVar8 = uVar8 + this->m_data[3];
      local_58 = local_58 ^ uVar4;
      uVar5 = ((uVar3 >> 0x15 | uVar3 << 0x2b) ^ uVar8) + local_70;
      local_70 = local_70 + this->m_data[4];
      uVar3 = uVar14 ^ uVar5;
      uVar8 = ((uVar8 >> 0x21 | uVar8 * 0x80000000) ^ local_70) + local_58;
      local_58 = local_58 + this->m_data[5];
      uVar6 = uVar6 ^ uVar8;
      uVar9 = ((local_70 >> 0x2f | local_70 * 0x20000) ^ local_58) + uVar3;
      uVar3 = uVar3 + this->m_data[6];
      uVar16 = uVar15 ^ uVar9;
      uVar10 = ((local_58 >> 0x24 | local_58 * 0x10000000) ^ uVar3) + uVar6;
      uVar6 = uVar6 + this->m_data[7];
      uVar7 = uVar7 ^ uVar10;
      uVar11 = ((uVar3 >> 0x19 | uVar3 << 0x27) ^ uVar6) + uVar16;
      uVar16 = uVar16 + this->m_data[8];
      uVar3 = uVar2 ^ uVar11;
      uVar6 = ((uVar6 >> 7 | uVar6 << 0x39) ^ uVar16) + uVar7;
      uVar7 = uVar7 + this->m_data[9];
      uVar12 = uVar12 ^ uVar6;
      uVar16 = ((uVar16 >> 9 | uVar16 << 0x37) ^ uVar7) + uVar3;
      uVar3 = uVar3 + this->m_data[10];
      uVar1 = uVar1 ^ uVar16;
      uVar7 = ((uVar7 >> 10 | uVar7 << 0x36) ^ uVar3) + uVar12;
      uVar12 = uVar12 + this->m_data[0xb];
      uVar4 = uVar4 ^ uVar7;
      uVar13 = ((uVar3 >> 0x2a | uVar3 * 0x400000) ^ uVar12) + uVar1;
      uVar1 = uVar1 + this->m_data[0xc];
      uVar5 = uVar5 ^ uVar13;
      uVar12 = ((uVar12 >> 0x12 | uVar12 << 0x2e) ^ uVar1) + uVar4;
      uVar4 = uVar4 + this->m_data[0xd];
      uVar8 = uVar8 ^ uVar12;
      uVar3 = ((uVar1 >> 0x35 | uVar1 * 0x800) ^ uVar4) + uVar5;
      uVar5 = uVar5 + this->m_data[0xe];
      uVar9 = uVar9 ^ uVar3;
      uVar4 = ((uVar4 >> 0x20 | uVar4 << 0x20) ^ uVar5) + uVar8;
      uVar8 = uVar8 + this->m_data[0xf];
      uVar10 = uVar10 ^ uVar4;
      local_78 = ((uVar5 >> 0x15 | uVar5 << 0x2b) ^ uVar8) + uVar9;
      uVar9 = uVar9 + this->m_data[0x10];
      uVar11 = uVar11 ^ local_78;
      local_60 = ((uVar8 >> 0x21 | uVar8 * 0x80000000) ^ uVar9) + uVar10;
      uVar10 = uVar10 + this->m_data[0x11];
      uVar6 = uVar6 ^ local_60;
      local_70 = ((uVar9 >> 0x2f | uVar9 * 0x20000) ^ uVar10) + uVar11;
      uVar11 = uVar11 + this->m_data[0x12];
      uVar16 = uVar16 ^ local_70;
      local_58 = ((uVar10 >> 0x24 | uVar10 * 0x10000000) ^ uVar11) + uVar6;
      uVar6 = uVar6 + this->m_data[0x13];
      uVar7 = uVar7 ^ local_58;
      uVar14 = ((uVar11 >> 0x19 | uVar11 << 0x27) ^ uVar6) + uVar16;
      uVar16 = uVar16 + this->m_data[0x14];
      uVar13 = uVar13 ^ uVar14;
      uVar6 = ((uVar6 >> 7 | uVar6 << 0x39) ^ uVar16) + uVar7;
      uVar7 = uVar7 + this->m_data[0x15];
      uVar12 = uVar12 ^ uVar6;
      uVar15 = ((uVar16 >> 9 | uVar16 << 0x37) ^ uVar7) + uVar13;
      uVar13 = uVar13 + this->m_data[0x16];
      uVar3 = uVar3 ^ uVar15;
      uVar7 = ((uVar7 >> 10 | uVar7 << 0x36) ^ uVar13) + uVar12;
      uVar12 = uVar12 + this->m_data[0x17];
      uVar4 = uVar4 ^ uVar7;
      local_68 = uVar12 >> 0x12 | uVar12 << 0x2e;
      uVar2 = ((uVar13 >> 0x2a | uVar13 * 0x400000) ^ uVar12) + uVar3;
    }
    __src = (long *)((long)message + (length / 0x60) * 0xc * 8);
    if (0 < (long)((length / 0x60) * 0x60)) {
      do {
        uVar3 = uVar3 + *message;
        uVar8 = (local_68 ^ uVar3) + uVar4;
        uVar4 = uVar4 + *(long *)((long)message + 8);
        uVar5 = local_60 ^ uVar8;
        uVar3 = ((uVar3 >> 0x35 | uVar3 * 0x800) ^ uVar4) + (local_78 ^ uVar2);
        uVar1 = (local_78 ^ uVar2) + *(long *)((long)message + 0x10);
        local_70 = local_70 ^ uVar3;
        uVar4 = ((uVar4 >> 0x20 | uVar4 << 0x20) ^ uVar1) + uVar5;
        uVar5 = uVar5 + *(long *)((long)message + 0x18);
        local_58 = local_58 ^ uVar4;
        local_78 = ((uVar1 >> 0x15 | uVar1 << 0x2b) ^ uVar5) + local_70;
        local_70 = local_70 + *(long *)((long)message + 0x20);
        local_60 = ((uVar5 >> 0x21 | uVar5 * 0x80000000) ^ local_70) + local_58;
        local_58 = local_58 + *(long *)((long)message + 0x28);
        local_70 = ((local_70 >> 0x2f | local_70 * 0x20000) ^ local_58) + (uVar14 ^ local_78);
        uVar1 = (uVar14 ^ local_78) + *(long *)((long)message + 0x30);
        local_58 = ((local_58 >> 0x24 | local_58 * 0x10000000) ^ uVar1) + (uVar6 ^ local_60);
        uVar6 = (uVar6 ^ local_60) + *(long *)((long)message + 0x38);
        uVar14 = ((uVar1 >> 0x19 | uVar1 << 0x27) ^ uVar6) + (uVar15 ^ local_70);
        uVar1 = (uVar15 ^ local_70) + *(long *)((long)message + 0x40);
        uVar6 = ((uVar6 >> 7 | uVar6 << 0x39) ^ uVar1) + (uVar7 ^ local_58);
        uVar7 = (uVar7 ^ local_58) + *(long *)((long)message + 0x48);
        uVar8 = uVar8 ^ uVar6;
        uVar15 = ((uVar1 >> 9 | uVar1 << 0x37) ^ uVar7) + (uVar2 ^ uVar14);
        uVar1 = (uVar2 ^ uVar14) + *(long *)((long)message + 0x50);
        uVar3 = uVar3 ^ uVar15;
        uVar7 = ((uVar7 >> 10 | uVar7 << 0x36) ^ uVar1) + uVar8;
        uVar8 = uVar8 + *(long *)((long)message + 0x58);
        uVar4 = uVar4 ^ uVar7;
        local_68 = uVar8 >> 0x12 | uVar8 << 0x2e;
        uVar2 = ((uVar1 >> 0x2a | uVar1 * 0x400000) ^ uVar8) + uVar3;
        message = (void *)((long)message + 0x60);
      } while (message < __src);
    }
    this->m_remainder = (uint8)(length % 0x60);
    memcpy(this,__src,length % 0x60);
    this->m_state[0] = uVar3;
    this->m_state[1] = uVar4;
    this->m_state[2] = local_78;
    this->m_state[3] = local_60;
    this->m_state[4] = local_70;
    this->m_state[5] = local_58;
    this->m_state[6] = uVar14;
    this->m_state[7] = uVar6;
    this->m_state[8] = uVar15;
    this->m_state[9] = uVar7;
    this->m_state[10] = uVar2;
    this->m_state[0xb] = local_68;
  }
  return;
}

Assistant:

void SpookyHash::Update(const void *message, size_t length)
{
    uint64 h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11;
    size_t newLength = length + m_remainder;
    uint8  remainder;
    union 
    { 
        const uint8 *p8; 
        uint64 *p64; 
        size_t i; 
    } u;
    const uint64 *end;
    
    // Is this message fragment too short?  If it is, stuff it away.
    if (newLength < sc_bufSize)
    {
        memcpy(&((uint8 *)m_data)[m_remainder], message, length);
        m_length = length + m_length;
        m_remainder = (uint8)newLength;
        return;
    }
    
    // init the variables
    if (m_length < sc_bufSize)
    {
        h0=h3=h6=h9  = m_state[0];
        h1=h4=h7=h10 = m_state[1];
        h2=h5=h8=h11 = sc_const;
    }
    else
    {
        h0 = m_state[0];
        h1 = m_state[1];
        h2 = m_state[2];
        h3 = m_state[3];
        h4 = m_state[4];
        h5 = m_state[5];
        h6 = m_state[6];
        h7 = m_state[7];
        h8 = m_state[8];
        h9 = m_state[9];
        h10 = m_state[10];
        h11 = m_state[11];
    }
    m_length = length + m_length;
    
    // if we've got anything stuffed away, use it now
    if (m_remainder)
    {
        uint8 prefix = sc_bufSize-m_remainder;
        memcpy(&(((uint8 *)m_data)[m_remainder]), message, prefix);
        u.p64 = m_data;
        Mix(u.p64, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
        Mix(&u.p64[sc_numVars], h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
        u.p8 = ((const uint8 *)message) + prefix;
        length -= prefix;
    }
    else
    {
        u.p8 = (const uint8 *)message;
    }
    
    // handle all whole blocks of sc_blockSize bytes
    end = u.p64 + (length/sc_blockSize)*sc_numVars;
    remainder = (uint8)(length-((const uint8 *)end-u.p8));
    if (ALLOW_UNALIGNED_READS || (u.i & 0x7) == 0)
    {
        while (u.p64 < end)
        { 
            Mix(u.p64, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
	    u.p64 += sc_numVars;
        }
    }
    else
    {
        while (u.p64 < end)
        { 
            memcpy(m_data, u.p8, sc_blockSize);
            Mix(m_data, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
	    u.p64 += sc_numVars;
        }
    }

    // stuff away the last few bytes
    m_remainder = remainder;
    memcpy(m_data, end, remainder);
    
    // stuff away the variables
    m_state[0] = h0;
    m_state[1] = h1;
    m_state[2] = h2;
    m_state[3] = h3;
    m_state[4] = h4;
    m_state[5] = h5;
    m_state[6] = h6;
    m_state[7] = h7;
    m_state[8] = h8;
    m_state[9] = h9;
    m_state[10] = h10;
    m_state[11] = h11;
}